

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O0

void update_mon_intrinsics(level *lev,monst *mon,obj *obj,boolean on,boolean silently)

{
  byte bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  char *str;
  bool bVar5;
  uint local_74;
  int local_6c;
  int local_68;
  int local_4c;
  boolean save_in_mklev_1;
  boolean save_in_mklev;
  boolean is_weapon;
  ulong uStack_48;
  int p;
  long props;
  obj *poStack_38;
  int which;
  obj *otmp;
  uchar mask;
  int unseen;
  boolean silently_local;
  boolean on_local;
  obj *obj_local;
  monst *mon_local;
  level *lev_local;
  
  props._4_4_ = (uint)objects[obj->otyp].oc_oprop;
  uStack_48 = obj->oprops;
  local_4c = 0;
  bVar5 = true;
  if ((obj->oclass != '\x02') && (bVar5 = false, obj->oclass == '\x06')) {
    bVar5 = objects[obj->otyp].oc_subtyp != '\0';
  }
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((bVar2 = false, ublindf == (obj *)0x0 || (bVar2 = false, ublindf->oartifact != '\x1d'))))
         || (((u.uprops[0x40].intrinsic == 0 &&
              ((u.uprops[0x40].extrinsic == 0 &&
               (bVar2 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
             (bVar2 = false, (mon->data->mflags3 & 0x200) == 0)))) goto LAB_00342b53;
      bVar1 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x00342aa0;
    }
  }
  else {
    bVar1 = worm_known(lev,mon);
joined_r0x00342aa0:
    bVar2 = false;
    if (bVar1 == 0) goto LAB_00342b53;
  }
  if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) ||
      (bVar2 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (bVar2 = false, (*(uint *)&mon->field_0x60 >> 7 & 1) == 0)) {
    bVar2 = (*(uint *)&mon->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
  }
LAB_00342b53:
  if ((((0x5e < obj->otyp) && (obj->otyp < 0x6a)) || ((0x53 < obj->otyp && (obj->otyp < 0x5f)))) &&
     ((obj_descr[objects[obj->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
      (iVar4 = strncmp(obj_descr[objects[obj->otyp].oc_descr_idx].oc_descr,"gold ",5), iVar4 == 0)))
     ) {
    if (on == '\0') {
      end_burn(obj,'\0');
    }
    else {
      begin_burn(lev,obj,'\0');
    }
    if ((((bVar2 ^ 1U) == 0) && (silently == '\0')) && (on != '\0')) {
      str = xname(obj);
      The(str);
      pline("%s begins to glow.");
    }
  }
  if (props._4_4_ != 0) goto LAB_00342c82;
  do {
    if (obj->otyp == 0x7c) {
      local_68 = 0xd;
    }
    else {
      if (obj->otyp == 0x4f) {
        local_6c = 0x19;
      }
      else {
        local_6c = 0;
        if (obj->otyp == 0x4c && urole.malenum != 0x168) {
          local_6c = 0x2e;
        }
      }
      local_68 = local_6c;
    }
    if (local_68 == 0xd) {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfffffffb | (uint)(on != '\0') << 2;
      if (on == '\0') {
        local_74 = *(uint *)&mon->field_0x60 >> 3 & 1;
      }
      else {
        local_74 = 0;
      }
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfffffffd | local_74 << 1;
    }
    do {
      do {
        if (uStack_48 == 0) {
LAB_0034308a:
          if (((on == '\0') && (mon == u.usteed)) && (obj->otyp == 0xf0)) {
            dismount_steed(1);
          }
          if (silently != '\0') {
            return;
          }
          if (mon->wormno == '\0') {
            if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
              if (((((u.uprops[0x1e].intrinsic != 0) ||
                    ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                   (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                  ((bVar5 = false, ublindf == (obj *)0x0 ||
                   (bVar5 = false, ublindf->oartifact != '\x1d')))) ||
                 (((u.uprops[0x40].intrinsic == 0 &&
                   ((u.uprops[0x40].extrinsic == 0 &&
                    (bVar5 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
                  (bVar5 = false, (mon->data->mflags3 & 0x200) == 0)))) goto LAB_003432f0;
              bVar1 = viz_array[mon->my][mon->mx] & 1;
              goto joined_r0x0034323d;
            }
          }
          else {
            bVar1 = worm_known(lev,mon);
joined_r0x0034323d:
            bVar5 = false;
            if (bVar1 == 0) goto LAB_003432f0;
          }
          if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) ||
              (bVar5 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
             (bVar5 = false, (*(uint *)&mon->field_0x60 >> 7 & 1) == 0)) {
            bVar5 = (*(uint *)&mon->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
          }
LAB_003432f0:
          if ((bVar2 ^ 1U) != (bVar5 ^ 1U)) {
            newsym((int)mon->mx,(int)mon->my);
          }
          return;
        }
        if (local_4c == 0) {
          local_4c = 1;
        }
        else {
          local_4c = local_4c << 1;
        }
        if (0xfffff < local_4c) goto LAB_0034308a;
      } while ((uStack_48 & (long)local_4c) == 0);
      uStack_48 = uStack_48 & ~(long)local_4c;
      if (local_4c == 1) {
        if (!bVar5) {
          props._4_4_ = 1;
        }
      }
      else if (local_4c == 2) {
        if (!bVar5) {
          props._4_4_ = 2;
        }
      }
      else if (local_4c == 4) {
        if (!bVar5) {
          props._4_4_ = 0x35;
        }
      }
      else if (local_4c == 0x10) {
        props._4_4_ = 0x2a;
      }
      else if (local_4c == 0x20) {
        props._4_4_ = 0x1a;
      }
      else if (local_4c == 0x400) {
        props._4_4_ = 0x19;
      }
      else if (local_4c == 0x800) {
        props._4_4_ = 0x2d;
      }
      else if (local_4c == 0x8000) {
        props._4_4_ = 0x25;
      }
      else if (local_4c == 0x80000) {
        props._4_4_ = 0x14;
      }
      else {
        props._4_4_ = 0;
      }
    } while (props._4_4_ == 0);
LAB_00342c82:
    bVar3 = in_mklev;
    if (on == '\0') {
      if (props._4_4_ - 1 < 8) {
        bVar1 = (byte)(1 << ((char)props._4_4_ - 1U & 0x1f));
        in_mklev = bVar3;
        if ((mon->data->mresists & bVar1) == 0) {
          poStack_38 = mon->minvent;
          while ((poStack_38 != (obj *)0x0 &&
                 ((poStack_38->owornmask == 0 ||
                  (bVar3 = obj_has_prop(poStack_38,props._4_4_), bVar3 == '\0'))))) {
            poStack_38 = poStack_38->nobj;
          }
          if (poStack_38 == (obj *)0x0) {
            mon->mintrinsics = mon->mintrinsics & (bVar1 ^ 0xffff);
          }
        }
      }
      else if (props._4_4_ == 0xd) {
        *(uint *)&mon->field_0x60 =
             *(uint *)&mon->field_0x60 & 0xfffffffd | (*(uint *)&mon->field_0x60 >> 3 & 1) << 1;
      }
      else {
        in_mklev = bVar3;
        if (props._4_4_ == 0x1a) {
          if (silently != '\0') {
            in_mklev = '\x01';
          }
          mon_adjust_speed(mon,0,obj);
          in_mklev = bVar3;
        }
      }
    }
    else {
      switch(props._4_4_) {
      case 0xd:
        *(uint *)&mon->field_0x60 =
             *(uint *)&mon->field_0x60 & 0xfffffffd |
             (uint)((*(uint *)&mon->field_0x60 >> 2 & 1) == 0) << 1;
        break;
      default:
        in_mklev = bVar3;
        if (props._4_4_ < 9) {
          mon->mintrinsics = mon->mintrinsics | (ushort)(byte)(1 << ((char)props._4_4_ - 1U & 0x1f))
          ;
        }
        break;
      case 0x12:
      case 0x27:
        in_mklev = bVar3;
        break;
      case 0x13:
      case 0x19:
      case 0x2e:
        in_mklev = bVar3;
        break;
      case 0x16:
      case 0x25:
      case 0x26:
      case 0x2d:
        in_mklev = bVar3;
        break;
      case 0x1a:
        if (silently != '\0') {
          in_mklev = '\x01';
        }
        mon_adjust_speed(mon,0,obj);
        in_mklev = bVar3;
        break;
      case 0x2a:
      case 0x2c:
        in_mklev = bVar3;
      }
    }
  } while( true );
}

Assistant:

void update_mon_intrinsics(struct level *lev, struct monst *mon, struct obj *obj,
			   boolean on, boolean silently)
{
    int unseen;
    uchar mask;
    struct obj *otmp;
    int which = (int) objects[obj->otyp].oc_oprop;
    long props = obj->oprops;
    int p = 0;
    boolean is_weapon = (obj->oclass == WEAPON_CLASS || is_weptool(obj));

    unseen = !canseemon(lev, mon);

    if (Is_gold_dragon_armor(obj->otyp)) {
	if (on)
	    begin_burn(lev, obj, FALSE);
	else
	    end_burn(obj, FALSE);
	if (!unseen && !silently)
	    if (on) pline("%s begins to glow.", The(xname(obj)));
    }

    if (!which) goto maybe_blocks;

 new_property:

    if (on) {
	switch (which) {
	 case INVIS:
	    mon->minvis = !mon->invis_blkd;
	    break;
	 case FAST:
	  {
	    boolean save_in_mklev = in_mklev;
	    if (silently) in_mklev = TRUE;
	    mon_adjust_speed(mon, 0, obj);
	    in_mklev = save_in_mklev;
	    break;
	  }
	/* properties handled elsewhere */
	 case ANTIMAGIC:
	 case REFLECTING:
	    break;
	/* properties which have no effect for monsters */
	 case CLAIRVOYANT:
	 case STEALTH:
	 case TELEPAT:
	    break;
	/* properties which should have an effect but aren't implemented */
	 case LEVITATION:
	 case WWALKING:
	    break;
	/* properties which maybe should have an effect but don't */
	 case DISPLACED:
	 case FUMBLING:
	 case JUMPING:
	 case PROTECTION:
	    break;
	 default:
	    if (which <= 8) {	/* 1 thru 8 correspond to MR_xxx mask values */
		/* FIRE,COLD,SLEEP,DISINT,SHOCK,POISON,ACID,STONE */
		mask = (uchar) (1 << (which - 1));
		mon->mintrinsics |= (unsigned short) mask;
	    }
	    break;
	}
    } else {	    /* off */
	switch (which) {
	 case INVIS:
	    mon->minvis = mon->perminvis;
	    break;
	 case FAST:
	  {
	    boolean save_in_mklev = in_mklev;
	    if (silently) in_mklev = TRUE;
	    mon_adjust_speed(mon, 0, obj);
	    in_mklev = save_in_mklev;
	    break;
	  }
	 case FIRE_RES:
	 case COLD_RES:
	 case SLEEP_RES:
	 case DISINT_RES:
	 case SHOCK_RES:
	 case POISON_RES:
	 case ACID_RES:
	 case STONE_RES:
	    mask = (uchar) (1 << (which - 1));
	    /* If the monster doesn't have this resistance intrinsically,
	       check whether any other worn item confers it.  Note that
	       we don't currently check for anything conferred via simply
	       carrying an object. */
	    if (!(mon->data->mresists & mask)) {
		for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
		    if (otmp->owornmask && obj_has_prop(otmp, which))
			break;
		if (!otmp)
		    mon->mintrinsics &= ~((unsigned short) mask);
	    }
	    break;
	 default:
	    break;
	}
    }

 maybe_blocks:
    /* obj->owornmask has been cleared by this point, so we can't use it.
       However, since monsters don't wield armor, we don't have to guard
       against that and can get away with a blanket worn-mask value. */
    switch (w_blocks(obj,~0L)) {
     case INVIS:
	mon->invis_blkd = on ? 1 : 0;
	mon->minvis = on ? 0 : mon->perminvis;
	break;
     default:
	break;
    }

    /* Repeat most of the above (goto new_property) for each property. */
    while (props) {
	if (p == 0) p = 1;
	else p <<= 1;

	if (p > ITEM_PROP_MASK) break;
	if (!(props & p)) continue;

	props &= ~p;

	switch (p) {
	case ITEM_FIRE:
	    if (!is_weapon) which = FIRE_RES;
	    break;
	case ITEM_FROST:
	    if (!is_weapon) which = COLD_RES;
	    break;
	case ITEM_DRLI:
	    if (!is_weapon) which = DRAIN_RES;
	    break;
	case ITEM_REFLECTION:	which = REFLECTING; break;
	case ITEM_SPEED:	which = FAST; break;
	case ITEM_ESP:		which = TELEPAT; break;
	case ITEM_DISPLACEMENT:	which = DISPLACED; break;
	case ITEM_FUMBLING:	which = FUMBLING; break;
	case ITEM_AGGRAVATE:	which = AGGRAVATE_MONSTER; break;
	default:		which = 0; break;
	}

	if (which) goto new_property;
    }

	if (!on && mon == u.usteed && obj->otyp == SADDLE)
	    dismount_steed(DISMOUNT_FELL);

    /* if couldn't see it but now can, or vice versa, update display */
    if (!silently && (unseen ^ !canseemon(lev, mon)))
	newsym(mon->mx, mon->my);
}